

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O3

bool AM_clipMline(mline_t *ml,fline_t *fl)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  bool bVar21;
  double dVar22;
  int local_74;
  uint local_70;
  uint local_6c;
  int local_68;
  int local_64;
  uint local_60;
  uint local_5c;
  int local_58;
  int local_54;
  uint local_50;
  uint local_4c;
  
  dVar6 = m_x;
  dVar5 = scale_mtof;
  dVar1 = (ml->a).y;
  uVar9 = 8;
  uVar11 = 8;
  if ((dVar1 <= m_y2) && (uVar11 = 0, dVar1 < m_y)) {
    uVar11 = 4;
  }
  dVar2 = (ml->b).y;
  if ((dVar2 <= m_y2) && (uVar9 = 0, dVar2 < m_y)) {
    uVar9 = 4;
  }
  if ((uVar9 & uVar11) == 0) {
    dVar3 = (ml->a).x;
    if (m_x <= dVar3) {
      if (m_x2 < dVar3) {
        uVar11 = uVar11 | 2;
      }
    }
    else {
      uVar11 = uVar11 | 1;
    }
    dVar4 = (ml->b).x;
    if (m_x <= dVar4) {
      if (m_x2 < dVar4) {
        uVar9 = uVar9 | 2;
      }
    }
    else {
      uVar9 = uVar9 | 1;
    }
    if ((uVar9 & uVar11) == 0) {
      uVar13 = (uint)((dVar3 - m_x) * scale_mtof);
      (fl->a).x = uVar13;
      iVar8 = f_h;
      dVar3 = m_y;
      dVar22 = (double)f_h;
      iVar17 = (int)(dVar22 - (dVar1 - m_y) * dVar5);
      bVar21 = f_h <= iVar17;
      (fl->a).y = iVar17;
      uVar11 = (uint)((dVar4 - dVar6) * dVar5);
      iVar18 = (int)(dVar22 - (dVar2 - dVar3) * dVar5);
      (fl->b).x = uVar11;
      (fl->b).y = iVar18;
      iVar7 = f_w;
      uVar9 = 8;
      if (-1 < iVar17) {
        uVar9 = (uint)bVar21 << 2;
      }
      if ((int)uVar13 < 0) {
        uVar9 = uVar9 | 1;
      }
      else if (f_w <= (int)uVar13) {
        uVar9 = uVar9 | 2;
      }
      uVar16 = 8;
      if (-1 < iVar18) {
        uVar16 = (uint)(iVar8 <= iVar18) << 2;
      }
      if ((int)uVar11 < 0) {
        uVar16 = uVar16 | 1;
      }
      else if (f_w <= (int)uVar11) {
        uVar16 = uVar16 | 2;
      }
      uVar10 = 0;
      if ((uVar16 & uVar9) != 0) {
        return false;
      }
      uVar12 = f_w - 1;
      iVar14 = 0;
      iVar19 = iVar17;
      local_74 = iVar18;
      local_70 = uVar11;
      local_6c = uVar13;
      local_68 = iVar18;
      local_64 = iVar17;
      local_60 = uVar11;
      local_5c = uVar13;
      local_58 = iVar18;
      local_54 = iVar17;
      local_50 = uVar13;
      local_4c = uVar11;
      do {
        bVar21 = uVar16 == 0 && uVar9 == 0;
        if (bVar21) {
          return bVar21;
        }
        uVar15 = uVar9;
        if (uVar9 == 0) {
          uVar15 = uVar16;
        }
        if ((uVar15 & 8) == 0) {
          if ((uVar15 & 4) == 0) {
            if ((uVar15 & 2) == 0) {
              if ((uVar15 & 1) != 0) {
                local_5c = local_50;
                local_60 = local_4c;
                local_64 = local_54;
                local_68 = local_58;
                local_6c = local_50;
                local_70 = local_4c;
                local_74 = local_58;
                uVar11 = local_4c;
                uVar10 = 0;
                uVar13 = local_50;
                iVar17 = local_54;
                iVar18 = local_58;
                iVar19 = local_54;
                iVar14 = (int)(((long)(int)-local_50 * (long)(local_58 - local_54)) /
                              (long)(int)(local_4c - local_50)) + local_54;
              }
            }
            else {
              local_6c = local_5c;
              local_70 = local_60;
              local_74 = local_68;
              uVar11 = local_60;
              uVar10 = uVar12;
              uVar13 = local_5c;
              iVar17 = local_64;
              iVar18 = local_68;
              iVar19 = local_64;
              iVar14 = (int)(((long)(int)(~local_5c + iVar7) * (long)(local_68 - local_64)) /
                            (long)(int)(local_60 - local_5c)) + local_64;
            }
          }
          else {
            uVar10 = (int)(((long)(iVar19 - iVar8) * (long)(int)(local_70 - local_6c)) /
                          (long)(iVar19 - local_74)) + local_6c;
            uVar11 = local_70;
            uVar13 = local_6c;
            iVar17 = iVar19;
            iVar18 = local_74;
            iVar14 = iVar8 + -1;
          }
        }
        else {
          uVar10 = (int)(((long)iVar17 * (long)(int)(uVar11 - uVar13)) / (long)(iVar17 - iVar18)) +
                   uVar13;
          iVar14 = 0;
        }
        uVar20 = 8;
        if (-1 < iVar14) {
          uVar20 = (uint)(iVar8 <= iVar14) << 2;
        }
        if (uVar15 == uVar9) {
          (fl->a).x = uVar10;
          (fl->a).y = iVar14;
          uVar13 = uVar10;
          iVar17 = iVar14;
          iVar19 = iVar14;
          local_6c = uVar10;
          local_64 = iVar14;
          local_5c = uVar10;
          local_54 = iVar14;
          local_50 = uVar10;
          if ((int)uVar10 < 0) {
            uVar9 = uVar20 | 1;
          }
          else {
            uVar9 = uVar20 | 2;
            if ((int)uVar10 < iVar7) {
              uVar9 = uVar20;
            }
          }
        }
        else {
          (fl->b).x = uVar10;
          (fl->b).y = iVar14;
          uVar11 = uVar10;
          iVar18 = iVar14;
          local_74 = iVar14;
          local_70 = uVar10;
          local_68 = iVar14;
          local_60 = uVar10;
          local_58 = iVar14;
          local_4c = uVar10;
          if ((int)uVar10 < 0) {
            uVar16 = uVar20 | 1;
          }
          else {
            uVar16 = uVar20 | 2;
            if ((int)uVar10 < iVar7) {
              uVar16 = uVar20;
            }
          }
        }
      } while ((uVar16 & uVar9) == 0);
      return bVar21;
    }
  }
  return false;
}

Assistant:

bool AM_clipMline (mline_t *ml, fline_t *fl)
{
	enum {
		LEFT	=1,
		RIGHT	=2,
		BOTTOM	=4,
		TOP		=8
	};

	int outcode1 = 0;
	int outcode2 = 0;
	int outside;

	fpoint_t tmp = { 0, 0 };
	int dx;
	int dy;

#define DOOUTCODE(oc, mx, my) \
	(oc) = 0; \
	if ((my) < 0) (oc) |= TOP; \
	else if ((my) >= f_h) (oc) |= BOTTOM; \
	if ((mx) < 0) (oc) |= LEFT; \
	else if ((mx) >= f_w) (oc) |= RIGHT;

	// do trivial rejects and outcodes
	if (ml->a.y > m_y2)
		outcode1 = TOP;
	else if (ml->a.y < m_y)
		outcode1 = BOTTOM;

	if (ml->b.y > m_y2)
		outcode2 = TOP;
	else if (ml->b.y < m_y)
		outcode2 = BOTTOM;

	if (outcode1 & outcode2)
		return false; // trivially outside

	if (ml->a.x < m_x)
		outcode1 |= LEFT;
	else if (ml->a.x > m_x2)
		outcode1 |= RIGHT;

	if (ml->b.x < m_x)
		outcode2 |= LEFT;
	else if (ml->b.x > m_x2)
		outcode2 |= RIGHT;

	if (outcode1 & outcode2)
		return false; // trivially outside

	// transform to frame-buffer coordinates.
	fl->a.x = CXMTOF(ml->a.x);
	fl->a.y = CYMTOF(ml->a.y);
	fl->b.x = CXMTOF(ml->b.x);
	fl->b.y = CYMTOF(ml->b.y);

	DOOUTCODE(outcode1, fl->a.x, fl->a.y);
	DOOUTCODE(outcode2, fl->b.x, fl->b.y);

	if (outcode1 & outcode2)
		return false;

	while (outcode1 | outcode2) {
		// may be partially inside box
		// find an outside point
		if (outcode1)
			outside = outcode1;
		else
			outside = outcode2;
	
		// clip to each side
		if (outside & TOP)
		{
			dy = fl->a.y - fl->b.y;
			dx = fl->b.x - fl->a.x;
			tmp.x = fl->a.x + Scale(dx, fl->a.y, dy);
			tmp.y = 0;
		}
		else if (outside & BOTTOM)
		{
			dy = fl->a.y - fl->b.y;
			dx = fl->b.x - fl->a.x;
			tmp.x = fl->a.x + Scale(dx, fl->a.y - f_h, dy);
			tmp.y = f_h-1;
		}
		else if (outside & RIGHT)
		{
			dy = fl->b.y - fl->a.y;
			dx = fl->b.x - fl->a.x;
			tmp.y = fl->a.y + Scale(dy, f_w-1 - fl->a.x, dx);
			tmp.x = f_w-1;
		}
		else if (outside & LEFT)
		{
			dy = fl->b.y - fl->a.y;
			dx = fl->b.x - fl->a.x;
			tmp.y = fl->a.y + Scale(dy, -fl->a.x, dx);
			tmp.x = 0;
		}

		if (outside == outcode1)
		{
			fl->a = tmp;
			DOOUTCODE(outcode1, fl->a.x, fl->a.y);
		}
		else
		{
			fl->b = tmp;
			DOOUTCODE(outcode2, fl->b.x, fl->b.y);
		}
	
		if (outcode1 & outcode2)
			return false; // trivially outside
	}

	return true;
}